

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O2

string * iconv_convert_abi_cxx11_(string *__return_storage_ptr__,char *src,size_t len,iconv_t conv)

{
  size_t sVar1;
  int *piVar2;
  size_type *psVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  char *bufptr;
  size_t outlen;
  char buffer [512];
  char *local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_270;
  size_type local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  size_t local_250;
  size_t local_248;
  char *local_240;
  char local_238 [520];
  
  local_270 = &local_260;
  local_268 = 0;
  local_260._M_local_buf[0] = '\0';
  local_248 = len;
  local_240 = src;
  do {
    local_250 = 0x200;
    local_278 = local_238;
    sVar1 = iconv(conv,&local_240,&local_248,&local_278,&local_250);
    std::__cxx11::string::append<char*,void>((string *)&local_270,local_238,local_278);
    if (sVar1 != 0xffffffffffffffff) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      paVar4 = &local_260;
      if (local_270 == paVar4) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_260._M_allocated_capacity._1_7_,local_260._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_260._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_270;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_260._M_allocated_capacity._1_7_,local_260._M_local_buf[0]);
      }
      __return_storage_ptr__->_M_string_length = local_268;
      psVar3 = &local_268;
      local_270 = paVar4;
      goto LAB_001095e1;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 7);
  perror("Failed string encoding conversion:");
  paVar4 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar4;
  psVar3 = &__return_storage_ptr__->_M_string_length;
LAB_001095e1:
  *psVar3 = 0;
  paVar4->_M_local_buf[0] = '\0';
  std::__cxx11::string::~string((string *)&local_270);
  return __return_storage_ptr__;
}

Assistant:

static std::string iconv_convert(const char* src, size_t len, iconv_t conv) {
	std::string out;
	char buffer[512];
	size_t res;
	do {
		char* bufptr = buffer;
		size_t outlen = sizeof(buffer);
		res = iconv(conv, const_cast<char**>(&src), &len, &bufptr, &outlen);
		out.append(buffer, bufptr);
	} while (res == (size_t)-1 && errno == E2BIG);
	if (res == -1) {
		perror("Failed string encoding conversion:");
		return std::string();
	}
	return out;
}